

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O3

deBool qpTestLog_endSampleList(qpTestLog *log)

{
  deBool dVar1;
  
  deMutex_lock(log->lock);
  dVar1 = qpXmlWriter_endElement(log->writer,"SampleList");
  if (dVar1 == 0) {
    qpPrintf("qpTestLog_endSampleList(): Writing XML failed\n");
  }
  deMutex_unlock(log->lock);
  return (uint)(dVar1 != 0);
}

Assistant:

deBool qpTestLog_endSampleList (qpTestLog* log)
{
	DE_ASSERT(log);
	deMutex_lock(log->lock);

	if (!qpXmlWriter_endElement(log->writer, "SampleList"))
	{
		qpPrintf("qpTestLog_endSampleList(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	DE_ASSERT(ContainerStack_pop(&log->containerStack) == CONTAINERTYPE_SAMPLELIST);

	deMutex_unlock(log->lock);
	return DE_TRUE;
}